

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zip_ftell.c
# Opt level: O2

zip_int64_t zip_ftell(zip_file_t *zf)

{
  zip_int64_t zVar1;
  zip_int64_t zVar2;
  
  zVar1 = -1;
  zVar2 = zVar1;
  if (((zf != (zip_file_t *)0x0) && ((zf->error).zip_err == 0)) &&
     (zVar2 = zip_source_tell(zf->src), zVar2 < 0)) {
    zip_error_set_from_source(&zf->error,zf->src);
    zVar2 = zVar1;
  }
  return zVar2;
}

Assistant:

ZIP_EXTERN zip_int64_t
zip_ftell(zip_file_t *zf) {
    zip_int64_t res;

    if (zf == NULL) {
        return -1;
    }

    if (zf->error.zip_err != 0) {
        return -1;
    }

    res = zip_source_tell(zf->src);
    if (res < 0) {
        zip_error_set_from_source(&zf->error, zf->src);
        return -1;
    }

    return res;
}